

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::readFrameProperties(DumpReader *this,istream *inputStream)

{
  bool bVar1;
  SnapshotManager *this_00;
  long lVar2;
  long *plVar3;
  undefined8 uVar4;
  element_type *peVar5;
  StringTokenizer *this_01;
  double *pdVar6;
  char *in_RSI;
  undefined8 *in_RDI;
  RealType RVar7;
  shared_ptr<OpenMD::SPFData> spfData;
  Mat3x3d eta;
  pair<double,_double> thermostat;
  Mat3x3d hmat;
  RealType currTime;
  string propertyName;
  StringTokenizer tokenizer;
  string line;
  Snapshot *s;
  errorStruct *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  StringTokenizer *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  Mat3x3d *in_stack_fffffffffffffcf8;
  Snapshot *in_stack_fffffffffffffd00;
  StringTokenizer *in_stack_fffffffffffffd18;
  Snapshot *in_stack_fffffffffffffd80;
  RectMatrix<double,_3U,_3U> local_198;
  pair<double,_double> local_150;
  RectMatrix<double,_3U,_3U> local_140;
  RealType local_f8;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [143];
  allocator<char> local_39;
  string local_38 [32];
  Snapshot *local_18;
  char *local_10;
  
  local_10 = in_RSI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::clearDerivedProperties(in_stack_fffffffffffffd80);
  std::istream::getline(local_10,(long)in_RDI + 0x256);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
             (char *)in_stack_fffffffffffffca8,(allocator<char> *)in_stack_fffffffffffffca0);
  std::allocator<char>::~allocator(&local_39);
  lVar2 = std::__cxx11::string::find((char *)local_38,0x307370);
  if (lVar2 == -1) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Missing <FrameData>\n");
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    plVar3 = (long *)std::istream::getline(local_10,(long)in_RDI + 0x256);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator=(local_38,(char *)((long)in_RDI + 0x256));
    lVar2 = std::__cxx11::string::find((char *)local_38,0x3073a3);
    if (lVar2 != -1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
               (char *)in_stack_fffffffffffffca8,(allocator<char> *)in_stack_fffffffffffffca0);
    StringTokenizer::StringTokenizer
              ((StringTokenizer *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
               in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = StringTokenizer::hasMoreTokens(in_stack_fffffffffffffc78);
    if (!bVar1) {
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",uVar4);
      painCave.isFatal = 1;
      simError();
    }
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffd18);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                            in_stack_fffffffffffffc68->errMsg);
    if (bVar1) {
      local_f8 = StringTokenizer::nextTokenAsDouble
                           ((StringTokenizer *)
                            CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      Snapshot::setTime(local_18,local_f8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                              in_stack_fffffffffffffc68->errMsg);
      if (bVar1) {
        SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x165c9b);
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,0,0);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,0,1);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,0,2);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,1,0);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,1,1);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,1,2);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,2,0);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,2,1);
        *pdVar6 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_140,2,2);
        *pdVar6 = RVar7;
        Snapshot::setHmat(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x165f67);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                in_stack_fffffffffffffc68->errMsg);
        if (bVar1) {
          std::pair<double,_double>::pair<double,_double,_true>(&local_150);
          local_150.first =
               StringTokenizer::nextTokenAsDouble
                         ((StringTokenizer *)
                          CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
          local_150.second =
               StringTokenizer::nextTokenAsDouble
                         ((StringTokenizer *)
                          CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
          Snapshot::setThermostat
                    ((Snapshot *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (pair<double,_double> *)in_stack_fffffffffffffc68);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc68->errMsg);
          if (bVar1) {
            SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x166075);
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,0,0);
            *pdVar6 = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,0,1);
            *pdVar6 = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            in_stack_fffffffffffffd18 =
                 (StringTokenizer *)RectMatrix<double,_3U,_3U>::operator()(&local_198,0,2);
            *(RealType *)&in_stack_fffffffffffffd18->tokenString_ = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,1,0);
            *pdVar6 = RVar7;
            in_stack_fffffffffffffd00 =
                 (Snapshot *)
                 StringTokenizer::nextTokenAsDouble
                           ((StringTokenizer *)
                            CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            in_stack_fffffffffffffcf8 =
                 (Mat3x3d *)RectMatrix<double,_3U,_3U>::operator()(&local_198,1,1);
            (in_stack_fffffffffffffcf8->super_SquareMatrix<double,_3>).
            super_RectMatrix<double,_3U,_3U>.data_[0][0] = (double)in_stack_fffffffffffffd00;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,1,2);
            *pdVar6 = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,2,0);
            *pdVar6 = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,2,1);
            *pdVar6 = RVar7;
            RVar7 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()(&local_198,2,2);
            *pdVar6 = RVar7;
            Snapshot::setBarostat
                      ((Snapshot *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (Mat3x3d *)in_stack_fffffffffffffc68);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16631d);
          }
          else {
            in_stack_fffffffffffffcb7 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                 in_stack_fffffffffffffc68->errMsg);
            if ((bool)in_stack_fffffffffffffcb7) {
              Snapshot::getSPFData((Snapshot *)in_stack_fffffffffffffc68);
              in_stack_fffffffffffffca8 =
                   (string *)
                   StringTokenizer::nextTokenAsDouble
                             ((StringTokenizer *)
                              CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
              peVar5 = std::
                       __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1663a8);
              in_stack_fffffffffffffca0 =
                   (string *)Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar5,0);
              *(string **)in_stack_fffffffffffffca0 = in_stack_fffffffffffffca8;
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)
                                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
              peVar5 = std::
                       __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1663ea);
              this_01 = (StringTokenizer *)
                        Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar5,1);
              *(RealType *)&this_01->tokenString_ = RVar7;
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)
                                 CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
              peVar5 = std::
                       __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x16642f);
              pdVar6 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar5,2);
              *pdVar6 = RVar7;
              in_stack_fffffffffffffc78 =
                   (StringTokenizer *)
                   StringTokenizer::nextTokenAsDouble
                             ((StringTokenizer *)
                              CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
              peVar5 = std::
                       __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x166474);
              peVar5->lambda = (RealType)in_stack_fffffffffffffc78;
              in_stack_fffffffffffffc74 = StringTokenizer::nextTokenAsInt(this_01);
              peVar5 = std::
                       __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x16649f);
              peVar5->globalID = in_stack_fffffffffffffc74;
              std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x1664b3)
              ;
            }
            else {
              uVar4 = std::__cxx11::string::c_str();
              in_stack_fffffffffffffc68 = &painCave;
              snprintf(painCave.errMsg,2000,
                       "DumpReader Error: %s is an invalid property in <FrameData>\n",uVar4);
              *(undefined4 *)
               ((((Snapshot *)in_stack_fffffffffffffc68)->frameData).selectionPotentials.data_ + 4)
                   = 0;
              simError();
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_f0);
    StringTokenizer::~StringTokenizer
              ((StringTokenizer *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DumpReader::readFrameProperties(std::istream& inputStream) {
    Snapshot* s = info_->getSnapshotManager()->getCurrentSnapshot();
    // We're about to overwrite all frame properties, so clear out any
    // derived properties from previous use:
    s->clearDerivedProperties();

    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }

      StringTokenizer tokenizer(line, " ;\t\n\r{}:,");
      if (!tokenizer.hasMoreTokens()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
        painCave.isFatal = 1;
        simError();
      }

      std::string propertyName = tokenizer.nextToken();
      if (propertyName == "Time") {
        RealType currTime = tokenizer.nextTokenAsDouble();
        s->setTime(currTime);
      } else if (propertyName == "Hmat") {
        Mat3x3d hmat;
        hmat(0, 0) = tokenizer.nextTokenAsDouble();
        hmat(0, 1) = tokenizer.nextTokenAsDouble();
        hmat(0, 2) = tokenizer.nextTokenAsDouble();
        hmat(1, 0) = tokenizer.nextTokenAsDouble();
        hmat(1, 1) = tokenizer.nextTokenAsDouble();
        hmat(1, 2) = tokenizer.nextTokenAsDouble();
        hmat(2, 0) = tokenizer.nextTokenAsDouble();
        hmat(2, 1) = tokenizer.nextTokenAsDouble();
        hmat(2, 2) = tokenizer.nextTokenAsDouble();
        s->setHmat(hmat);
      } else if (propertyName == "Thermostat") {
        pair<RealType, RealType> thermostat;
        thermostat.first  = tokenizer.nextTokenAsDouble();
        thermostat.second = tokenizer.nextTokenAsDouble();
        s->setThermostat(thermostat);
      } else if (propertyName == "Barostat") {
        Mat3x3d eta;
        eta(0, 0) = tokenizer.nextTokenAsDouble();
        eta(0, 1) = tokenizer.nextTokenAsDouble();
        eta(0, 2) = tokenizer.nextTokenAsDouble();
        eta(1, 0) = tokenizer.nextTokenAsDouble();
        eta(1, 1) = tokenizer.nextTokenAsDouble();
        eta(1, 2) = tokenizer.nextTokenAsDouble();
        eta(2, 0) = tokenizer.nextTokenAsDouble();
        eta(2, 1) = tokenizer.nextTokenAsDouble();
        eta(2, 2) = tokenizer.nextTokenAsDouble();
        s->setBarostat(eta);
      } else if (propertyName == "SPFData") {
        std::shared_ptr<SPFData> spfData = s->getSPFData();

        spfData->pos[0]   = tokenizer.nextTokenAsDouble();
        spfData->pos[1]   = tokenizer.nextTokenAsDouble();
        spfData->pos[2]   = tokenizer.nextTokenAsDouble();
        spfData->lambda   = tokenizer.nextTokenAsDouble();
        spfData->globalID = tokenizer.nextTokenAsInt();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an invalid property in <FrameData>\n",
                 propertyName.c_str());
        painCave.isFatal = 0;
        simError();
      }
    }
  }